

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O2

void __thiscall Ptex::v2_2::PtexSeparableKernel::mergeR(PtexSeparableKernel *this,BorderMode mode)

{
  int iVar1;
  int n;
  float *p;
  float fVar2;
  
  iVar1 = this->uw;
  n = (-1 << ((this->res).ulog2 & 0x1fU)) + this->u + iVar1;
  if (mode != m_black) {
    p = this->ku + ((long)iVar1 - (long)n);
    fVar2 = accumulate(p,n);
    p[-1] = fVar2 + p[-1];
    iVar1 = this->uw;
  }
  this->uw = iVar1 - n;
  return;
}

Assistant:

void mergeR(BorderMode mode)
    {
        int w = uw + u - res.u();
        float* kp = ku + uw - w;
        if (mode != m_black)
            kp[-1] += accumulate(kp, w);
        uw -= w;
    }